

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# override_overload_overwrite.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  Base *this;
  Derived *this_00;
  
  this = (Base *)operator_new(8);
  this->_vptr_Base = (_func_int **)&PTR_G_00103d88;
  Base::F(this);
  (**this->_vptr_Base)(this);
  this_00 = (Derived *)operator_new(8);
  (this_00->super_Base)._vptr_Base = (_func_int **)&PTR_G_00103d88;
  Derived::F(this_00);
  (**(this_00->super_Base)._vptr_Base)(this_00);
  operator_delete(this,8);
  operator_delete(this_00,8);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Base* pBase = new Derived();
	pBase->F(); // Base.F
	pBase->G(); // Derived.G
	pBase->Add(1, 2);
	pBase->Add(1.2f, 2.1f);


	Derived* pD = new Derived();
	pD->F(); // Derived.F
	pD->G(); // Derived.G
	pD->Add(1, 2);
	pD->Add(2.1f, 1.2f);

	delete pBase;
	delete pD;

	return 0;
}